

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportFileGenerator::GenerateImportHeaderCode
          (cmExportFileGenerator *this,ostream *os,string *config)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  cmExportFileGenerator *this_00;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"#----------------------------------------------------------------\n",0x42);
  std::__ostream_insert<char,std::char_traits<char>>(os,"# Generated CMake target import file",0x24)
  ;
  if (config->_M_string_length == 0) {
    pcVar3 = ".\n";
    lVar2 = 2;
    poVar1 = os;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os," for configuration \"",0x14);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(config->_M_dataplus)._M_p,config->_M_string_length);
    pcVar3 = "\".\n";
    lVar2 = 3;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"#----------------------------------------------------------------\n",0x42);
  this_00 = (cmExportFileGenerator *)os;
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  GenerateImportVersionCode(this_00,os);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportHeaderCode(std::ostream& os,
                                                     const std::string& config)
{
  os << "#----------------------------------------------------------------\n"
     << "# Generated CMake target import file";
  if (!config.empty()) {
    os << " for configuration \"" << config << "\".\n";
  } else {
    os << ".\n";
  }
  os << "#----------------------------------------------------------------\n"
     << "\n";
  this->GenerateImportVersionCode(os);
}